

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Expression.cpp
# Opt level: O1

Expression *
slang::ast::Expression::bindArgument
          (Type *argType,ArgumentDirection direction,bitmask<slang::ast::VariableFlags> argFlags,
          ExpressionSyntax *syntax,ASTContext *context)

{
  undefined1 auVar1 [16];
  SourceLocation SVar2;
  Expression *pEVar3;
  bitmask<slang::ast::ASTFlags> in_stack_00000008;
  Token local_38;
  
  if (direction - Out < 2) {
    local_38 = slang::syntax::SyntaxNode::getFirstToken(&syntax->super_SyntaxNode);
    SVar2 = parsing::Token::location(&local_38);
    pEVar3 = bindLValue(syntax,argType,SVar2,context,direction == InOut);
  }
  else {
    if (direction != Ref) {
      auVar1._8_8_ = 0;
      auVar1._0_8_ = context;
      pEVar3 = bindRValue((Expression *)argType,(Type *)syntax,(ExpressionSyntax *)0x0,
                          (SourceRange)(auVar1 << 0x40),(ASTContext *)0x0,in_stack_00000008);
      return pEVar3;
    }
    local_38 = slang::syntax::SyntaxNode::getFirstToken(&syntax->super_SyntaxNode);
    SVar2 = parsing::Token::location(&local_38);
    pEVar3 = bindRefArg(argType,argFlags,syntax,SVar2,context);
  }
  return pEVar3;
}

Assistant:

const Expression& Expression::bindArgument(const Type& argType, ArgumentDirection direction,
                                           bitmask<VariableFlags> argFlags,
                                           const ExpressionSyntax& syntax,
                                           const ASTContext& context) {
    switch (direction) {
        case ArgumentDirection::In:
            return bindRValue(argType, syntax, {}, context);
        case ArgumentDirection::Out:
        case ArgumentDirection::InOut:
            return bindLValue(syntax, argType, syntax.getFirstToken().location(), context,
                              direction == ArgumentDirection::InOut);
        case ArgumentDirection::Ref:
            return bindRefArg(argType, argFlags, syntax, syntax.getFirstToken().location(),
                              context);
    }
    SLANG_UNREACHABLE;
}